

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-ping-udp.c
# Opt level: O0

void pinger_write_ping(pinger_t_conflict *pinger)

{
  int iVar1;
  uv_buf_t uVar2;
  char *local_38;
  char *local_30;
  undefined1 auStack_20 [4];
  int r;
  uv_buf_t buf;
  pinger_t_conflict *pinger_local;
  
  buf.len = (size_t)pinger;
  uVar2 = uv_buf_init(PING,5);
  local_38 = uVar2.base;
  _auStack_20 = local_38;
  local_30 = (char *)uVar2.len;
  buf.base = local_30;
  iVar1 = uv_udp_try_send((uv_udp_t *)(buf.len + 8),(uv_buf_t *)auStack_20,1,
                          (sockaddr *)(buf.len + 0xe0));
  if (iVar1 < 0) {
    fprintf(_stderr,"Fatal error in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-ping-udp.c"
            ,0x55,"uv_udp_send failed");
    fflush(_stderr);
    abort();
  }
  return;
}

Assistant:

static void pinger_write_ping(pinger_t* pinger) {
  uv_buf_t buf;
  int r;

  buf = uv_buf_init(PING, sizeof(PING) - 1);
  r = uv_udp_try_send(&pinger->udp, &buf, 1,
                      (const struct sockaddr*) &pinger->server_addr);
  if (r < 0)
    FATAL("uv_udp_send failed");
}